

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O1

const_iterator
cmRemoveDuplicates<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
          (vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           *r)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  const_iterator __position;
  ulong uVar5;
  ConfigFileInfo *rhs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  size_t count;
  vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  unique;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  unsigned_long local_60;
  vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  local_58;
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  *local_40;
  value_type local_38;
  
  local_58.
  super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
        *)0x0;
  local_58.
  super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
        *)0x0;
  local_58.
  super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  ::reserve(&local_58,
            (long)(r->
                  super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(r->
                  super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 6);
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_60 = 0;
  rhs = (r->
        super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
        )._M_impl.super__Vector_impl_data._M_start;
  cVar4._M_current =
       (r->
       super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_40 = r;
  if (rhs != cVar4._M_current) {
    do {
      uVar5 = (long)local_58.
                    super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.
                    super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      __position._M_current =
           local_58.
           super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      while (uVar1 = uVar5, 0 < (long)uVar1) {
        uVar5 = uVar1 >> 1;
        iVar3 = std::__cxx11::string::compare((string *)__position._M_current[uVar5]._M_current);
        if (iVar3 < 0) {
          __position._M_current = __position._M_current + uVar5 + 1;
          uVar5 = ~uVar5 + uVar1;
        }
      }
      if ((__position._M_current ==
           local_58.
           super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (bVar2 = cmFindPackageCommand::ConfigFileInfo::operator==
                            ((__position._M_current)->_M_current,rhs), !bVar2)) {
        local_38._M_current = rhs;
        std::
        vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
        ::_M_insert_rval(&local_58,__position,&local_38);
      }
      else if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_78,
                   (iterator)
                   local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_60);
      }
      else {
        *local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_60;
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      rhs = rhs + 1;
      local_60 = local_60 + 1;
    } while (rhs != cVar4._M_current);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    cVar4 = cmRemoveIndices<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                      (local_40,&local_78);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
       *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (const_iterator)cVar4._M_current;
}

Assistant:

typename Range::const_iterator cmRemoveDuplicates(Range& r)
{
  typedef typename ContainerAlgorithms::RemoveDuplicatesAPI<Range> API;
  typedef typename API::value_type T;
  std::vector<T> unique;
  unique.reserve(r.size());
  std::vector<size_t> indices;
  size_t count = 0;
  const typename Range::const_iterator end = r.end();
  for (typename Range::const_iterator it = r.begin(); it != end;
       ++it, ++count) {
    const typename std::vector<T>::iterator low = std::lower_bound(
      unique.begin(), unique.end(), API::uniqueValue(it), API::lessThan);
    if (low == unique.end() || API::valueCompare(low, it)) {
      unique.insert(low, API::uniqueValue(it));
    } else {
      indices.push_back(count);
    }
  }
  if (indices.empty()) {
    return end;
  }
  return cmRemoveIndices(r, indices);
}